

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

bool __thiscall
chaiscript::detail::Dispatch_Function::operator==(Dispatch_Function *this,Proxy_Function_Base *rhs)

{
  pointer psVar1;
  pointer psVar2;
  _func_int **pp_Var3;
  
  if (rhs->_vptr_Proxy_Function_Base != (_func_int **)&PTR__Dispatch_Function_003fbc40) {
    __cxa_bad_cast();
  }
  psVar2 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_funcs).
           super__Vector_base<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pp_Var3 = rhs[1]._vptr_Proxy_Function_Base;
  if ((long)psVar1 - (long)psVar2 ==
      (long)rhs[1].m_types.
            super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
            _M_impl.super__Vector_impl_data._M_start - (long)pp_Var3) {
    if (psVar2 == psVar1) {
      return psVar2 == psVar1;
    }
    if ((psVar2->
        super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr == (element_type *)*pp_Var3) {
      do {
        pp_Var3 = pp_Var3 + 2;
        psVar2 = psVar2 + 1;
        if (psVar2 == psVar1) {
          return psVar2 == psVar1;
        }
      } while ((psVar2->
               super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr == (element_type *)*pp_Var3);
    }
  }
  return false;
}

Assistant:

bool operator==(const dispatch::Proxy_Function_Base &rhs) const noexcept override {
        try {
          const auto &dispatch_fun = dynamic_cast<const Dispatch_Function &>(rhs);
          return m_funcs == dispatch_fun.m_funcs;
        } catch (const std::bad_cast &) {
          return false;
        }
      }